

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# z80.cpp
# Opt level: O3

Operand * translateLiteral(Operand *__return_storage_ptr__,Operand *reg)

{
  char *pcVar1;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __s;
  pointer pcVar2;
  uint __val;
  _AutomatonPtr **pp_Var3;
  uint uVar4;
  bool bVar5;
  int iVar6;
  Operand *pOVar7;
  ulong uVar8;
  Operand *extraout_RAX;
  Operand *extraout_RAX_00;
  sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *psVar9;
  int *piVar10;
  long *plVar11;
  Operand *extraout_RAX_01;
  Operand *extraout_RAX_02;
  Operand *extraout_RAX_03;
  Operand *extraout_RAX_04;
  undefined8 uVar12;
  uint uVar13;
  long lVar14;
  _AutomatonPtr *p_Var15;
  size_type *psVar16;
  undefined1 *puVar17;
  int iVar18;
  uint uVar19;
  smatch match;
  string __str;
  basic_regex<char,_std::__cxx11::regex_traits<char>_> local_d8;
  undefined1 local_b8 [17];
  uint7 uStack_a7;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  _Stack_a0;
  sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_90;
  string local_70;
  string local_50;
  
  pcVar1 = (reg->value)._M_dataplus._M_p;
  if (*pcVar1 == '.') {
    local_b8._0_8_ = local_b8 + 0x10;
    local_b8._8_8_ = (pointer)0x0;
    stack0xffffffffffffff58 = (pointer)((ulong)uStack_a7 << 8);
    local_d8._0_8_ = &local_d8._M_automaton;
    std::__cxx11::string::
    _M_construct<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
              ((string *)&local_d8,pcVar1,pcVar1 + (reg->value)._M_string_length);
LAB_001169b3:
    std::__cxx11::string::operator=((string *)local_b8,(string *)&local_d8);
    if ((_AutomatonPtr *)local_d8._0_8_ != &local_d8._M_automaton) {
      operator_delete((void *)local_d8._0_8_,
                      (ulong)((long)&((local_d8._M_automaton.
                                       super___shared_ptr<const_std::__detail::_NFA<std::__cxx11::regex_traits<char>_>,_(__gnu_cxx::_Lock_policy)2>
                                      ._M_ptr)->super__NFA_base)._M_paren_stack.
                                     super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                     ._M_impl.super__Vector_impl_data._M_start + 1));
    }
    while (uVar8 = std::__cxx11::string::find(local_b8,0x11e519,0), uVar8 != 0xffffffffffffffff) {
      std::__cxx11::string::replace((ulong)local_b8,uVar8,(char *)0x1,0x11e19a);
    }
    local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_50,local_b8._0_8_,
               (long)&(((pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)local_b8._0_8_)->first)._M_current +
               (long)&(((pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)local_b8._8_8_)->first)._M_current);
    pOVar7 = literal(__return_storage_ptr__,&local_50);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
      pOVar7 = extraout_RAX;
    }
    if ((sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         *)local_b8._0_8_ ==
        (sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         *)(local_b8 + 0x10)) {
      return pOVar7;
    }
    puVar17 = (undefined1 *)
              ((long)&(stack0xffffffffffffff58->
                      super_pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ).first._M_current + 1);
  }
  else {
    if (*pcVar1 == '$') {
      if ((int)pcVar1[1] - 0x30U < 10) {
        iVar6 = parse_8bit_literal(&reg->value);
        pOVar7 = literal(__return_storage_ptr__,iVar6);
        return pOVar7;
      }
      if (pcVar1[1] == '.') {
        local_b8._0_8_ = local_b8 + 0x10;
        local_b8._8_8_ = (pointer)0x0;
        stack0xffffffffffffff58 = (pointer)((ulong)uStack_a7 << 8);
        local_d8._0_8_ = &local_d8._M_automaton;
        std::__cxx11::string::
        _M_construct<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
                  ((string *)&local_d8,pcVar1 + 1,pcVar1 + (reg->value)._M_string_length);
        goto LAB_001169b3;
      }
    }
    stack0xffffffffffffff58 = (pointer)0x0;
    _Stack_a0._M_current = (char *)0x0;
    local_b8._0_8_ =
         (sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *)0x0;
    local_b8._8_8_ = (pointer)0x0;
    std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::basic_regex
              (&local_d8,"(\\d+)\\(%esp\\)",0x10);
    __s._M_current = (reg->value)._M_dataplus._M_p;
    bVar5 = std::__detail::
            __regex_algo_impl<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>>,char,std::__cxx11::regex_traits<char>,(std::__detail::_RegexExecutorPolicy)0,true>
                      (__s,(__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            )(__s._M_current + (reg->value)._M_string_length),
                       (match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                        *)local_b8,&local_d8,0);
    std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::~basic_regex(&local_d8);
    if (bVar5) {
      lVar14 = local_b8._8_8_ - local_b8._0_8_;
      if ((lVar14 == 0) || (0xfffffffffffffffd < (lVar14 >> 3) * -0x5555555555555555 - 5U)) {
        psVar9 = (sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)(local_b8._0_8_ + lVar14 + -0x48);
      }
      else {
        psVar9 = (sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)(local_b8._0_8_ + 0x18);
      }
      if (psVar9->matched == true) {
        local_d8._0_8_ = &local_d8._M_automaton;
        std::__cxx11::string::
        _M_construct<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
                  ((string *)&local_d8,
                   (psVar9->
                   super_pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ).first._M_current,
                   (psVar9->
                   super_pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ).second._M_current);
      }
      else {
        local_d8._0_8_ = &local_d8._M_automaton;
        local_d8._8_8_ = 0;
        local_d8._M_automaton.
        super___shared_ptr<const_std::__detail::_NFA<std::__cxx11::regex_traits<char>_>,_(__gnu_cxx::_Lock_policy)2>
        ._M_ptr = (element_type *)
                  ((ulong)local_d8._M_automaton.
                          super___shared_ptr<const_std::__detail::_NFA<std::__cxx11::regex_traits<char>_>,_(__gnu_cxx::_Lock_policy)2>
                          ._M_ptr & 0xffffffffffffff00);
      }
      uVar12 = local_d8._0_8_;
      piVar10 = __errno_location();
      iVar6 = *piVar10;
      *piVar10 = 0;
      uVar8 = strtol((char *)uVar12,(char **)&local_90,10);
      if (local_90.
          super_pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .first._M_current == (char *)uVar12) {
        std::__throw_invalid_argument("stoi");
LAB_00116dfc:
        uVar12 = std::__throw_out_of_range("stoi");
        if ((sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_b8._0_8_ != &local_90) {
          operator_delete((void *)local_b8._0_8_,
                          (ulong)((long)&(stack0xffffffffffffff58->
                                         super_pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                         ).first._M_current + 1));
        }
        _Unwind_Resume(uVar12);
      }
      iVar18 = (int)uVar8;
      if (((long)iVar18 != uVar8) || (*piVar10 == 0x22)) goto LAB_00116dfc;
      if (*piVar10 == 0) {
        *piVar10 = iVar6;
      }
      uVar19 = (int)(((uint)(uVar8 >> 0x1f) & 1) + iVar18) >> 1;
      pp_Var3 = (_AutomatonPtr **)&local_d8._M_automaton;
      if ((_AutomatonPtr **)local_d8._0_8_ != pp_Var3) {
        operator_delete((void *)local_d8._0_8_,
                        (ulong)((long)&((local_d8._M_automaton.
                                         super___shared_ptr<const_std::__detail::_NFA<std::__cxx11::regex_traits<char>_>,_(__gnu_cxx::_Lock_policy)2>
                                        ._M_ptr)->super__NFA_base)._M_paren_stack.
                                       super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                       ._M_impl.super__Vector_impl_data._M_start + 1));
      }
      __val = -uVar19;
      if (0 < (int)uVar19) {
        __val = uVar19;
      }
      uVar19 = 1;
      if (9 < __val) {
        uVar8 = (ulong)__val;
        uVar4 = 4;
        do {
          uVar19 = uVar4;
          uVar13 = (uint)uVar8;
          if (uVar13 < 100) {
            uVar19 = uVar19 - 2;
            goto LAB_00116c88;
          }
          if (uVar13 < 1000) {
            uVar19 = uVar19 - 1;
            goto LAB_00116c88;
          }
          if (uVar13 < 10000) goto LAB_00116c88;
          uVar8 = uVar8 / 10000;
          uVar4 = uVar19 + 4;
        } while (99999 < uVar13);
        uVar19 = uVar19 + 1;
      }
LAB_00116c88:
      local_90.
      super_pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .first._M_current = &local_90.matched;
      std::__cxx11::string::_M_construct((ulong)&local_90,(iVar18 < -1) + (char)uVar19);
      std::__detail::__to_chars_10_impl<unsigned_int>
                (local_90.
                 super_pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 .first._M_current + (iVar18 < -1),uVar19,__val);
      plVar11 = (long *)std::__cxx11::string::replace((ulong)&local_90,0,(char *)0x0,0x11f41b);
      p_Var15 = (_AutomatonPtr *)(plVar11 + 2);
      if ((_AutomatonPtr *)*plVar11 == p_Var15) {
        local_d8._M_automaton.
        super___shared_ptr<const_std::__detail::_NFA<std::__cxx11::regex_traits<char>_>,_(__gnu_cxx::_Lock_policy)2>
        ._M_ptr = (p_Var15->
                  super___shared_ptr<const_std::__detail::_NFA<std::__cxx11::regex_traits<char>_>,_(__gnu_cxx::_Lock_policy)2>
                  )._M_ptr;
        local_d8._M_automaton.
        super___shared_ptr<const_std::__detail::_NFA<std::__cxx11::regex_traits<char>_>,_(__gnu_cxx::_Lock_policy)2>
        ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)plVar11[3];
        local_d8._0_8_ = pp_Var3;
      }
      else {
        local_d8._M_automaton.
        super___shared_ptr<const_std::__detail::_NFA<std::__cxx11::regex_traits<char>_>,_(__gnu_cxx::_Lock_policy)2>
        ._M_ptr = (p_Var15->
                  super___shared_ptr<const_std::__detail::_NFA<std::__cxx11::regex_traits<char>_>,_(__gnu_cxx::_Lock_policy)2>
                  )._M_ptr;
        local_d8._0_8_ = (_AutomatonPtr *)*plVar11;
      }
      local_d8._8_8_ = plVar11[1];
      *plVar11 = (long)p_Var15;
      plVar11[1] = 0;
      *(undefined1 *)(plVar11 + 2) = 0;
      plVar11 = (long *)std::__cxx11::string::append((char *)&local_d8);
      psVar16 = (size_type *)(plVar11 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar11 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar16) {
        local_70.field_2._M_allocated_capacity = *psVar16;
        local_70.field_2._8_8_ = plVar11[3];
        local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
      }
      else {
        local_70.field_2._M_allocated_capacity = *psVar16;
        local_70._M_dataplus._M_p = (pointer)*plVar11;
      }
      local_70._M_string_length = plVar11[1];
      *plVar11 = (long)psVar16;
      plVar11[1] = 0;
      *(undefined1 *)(plVar11 + 2) = 0;
      pOVar7 = literal(__return_storage_ptr__,&local_70);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_70._M_dataplus._M_p != &local_70.field_2) {
        operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
        pOVar7 = extraout_RAX_01;
      }
      if ((_AutomatonPtr **)local_d8._0_8_ != pp_Var3) {
        operator_delete((void *)local_d8._0_8_,
                        (ulong)((long)&((local_d8._M_automaton.
                                         super___shared_ptr<const_std::__detail::_NFA<std::__cxx11::regex_traits<char>_>,_(__gnu_cxx::_Lock_policy)2>
                                        ._M_ptr)->super__NFA_base)._M_paren_stack.
                                       super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                       ._M_impl.super__Vector_impl_data._M_start + 1));
        pOVar7 = extraout_RAX_02;
      }
      if ((bool *)local_90.
                  super_pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  .first._M_current != &local_90.matched) {
        operator_delete(local_90.
                        super_pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        .first._M_current,local_90._16_8_ + 1);
        pOVar7 = extraout_RAX_03;
      }
    }
    else {
      iVar6 = reg->reg_num;
      __return_storage_ptr__->type = reg->type;
      __return_storage_ptr__->reg_num = iVar6;
      (__return_storage_ptr__->value)._M_dataplus._M_p =
           (pointer)&(__return_storage_ptr__->value).field_2;
      pcVar2 = (reg->value)._M_dataplus._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&__return_storage_ptr__->value,pcVar2,
                 pcVar2 + (reg->value)._M_string_length);
      pOVar7 = extraout_RAX_00;
    }
    if ((sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         *)local_b8._0_8_ ==
        (sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         *)0x0) {
      return pOVar7;
    }
    puVar17 = (undefined1 *)((long)stack0xffffffffffffff58 - local_b8._0_8_);
  }
  operator_delete((void *)local_b8._0_8_,(ulong)puVar17);
  return extraout_RAX_04;
}

Assistant:

static Operand translateLiteral(const Operand reg) {
	// Number
	if (reg.value[0] == '$') {
		if (isdigit(reg.value[1])) {
			return literal(parse_8bit_literal(reg.value));
		}
	}
	if (reg.value[0] == '.' || (reg.value[0] =='$' && reg.value[1] == '.')) {
		std::string new_string;
		if (reg.value[0] == '$')
			new_string = std::string(std::next(reg.value.begin()), reg.value.end());
		else
			new_string = std::string(reg.value.begin(), reg.value.end());
		std::size_t pos;
		while ((pos = new_string.find(".")) != std::string::npos) {
			new_string.replace(pos, 1, "period_");
		}
		return literal(new_string);
	}
	std::smatch match;
	if (std::regex_match(reg.value, match, std::regex(R"((\d+)\(%esp\))"))) {
		// This is a stack index (e.g. "16(%esp)"). Convert this to a z80 index.
		int index = std::stoi(match[1]) / 2;
		return literal("(ix + " + std::to_string(index) + ")");
	}
	return reg;
}